

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_BanDatabase.cpp
# Opt level: O2

bool __thiscall RenX::BanDatabase::initialize(BanDatabase *this)

{
  undefined1 uVar1;
  Config *this_00;
  string_view in_key;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  getCore();
  this_00 = (Config *)Jupiter::Plugin::getConfig();
  s_abi_cxx11_(&bStack_58,"Bans.db",7);
  in_key._M_str = "BanDB";
  in_key._M_len = 5;
  Jupiter::Config::get<std::__cxx11::string>(&local_38,this_00,in_key,&bStack_58);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&this->m_filename,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&bStack_58);
  uVar1 = Jupiter::Database::process_file((string *)this);
  return (bool)uVar1;
}

Assistant:

bool RenX::BanDatabase::initialize() {
	m_filename = RenX::getCore()->getConfig().get("BanDB"sv, "Bans.db"s);
	return this->process_file(m_filename);
}